

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O0

void XPMP2::SoundUpdatesDone(void)

{
  bool bVar1;
  
  if (gpSndSys != (long *)0x0) {
    if ((DAT_0047ddaf & 1) != 0) {
      bVar1 = IsPaused();
      if (bVar1) {
        if ((DAT_0047ddb8 & 1) == 0) {
          XPMPSoundMute(false);
          DAT_0047ddb8 = 1;
        }
      }
      else if ((DAT_0047ddb8 & 1) != 0) {
        XPMPSoundMute(false);
        DAT_0047ddb8 = 0;
      }
    }
    (**(code **)(*gpSndSys + 0x48))();
  }
  return;
}

Assistant:

void SoundUpdatesDone ()
{
    if (!gpSndSys) return;

    // Mute-on-Pause
    if (glob.bSoundMuteOnPause) {                           // shall act automatically on Pause?
        if (IsPaused()) {                                   // XP is paused?
            if (!glob.bSoundAutoMuted) {                    // ...but not yet muted?
                XPMPSoundMute(true);                        //    -> do mute
                glob.bSoundAutoMuted = true;
            }
        } else {                                            // XP is not paused
            if (glob.bSoundAutoMuted) {                     // ...but sound is auto-muted?
                XPMPSoundMute(false);                       //    -> unmute
                glob.bSoundAutoMuted = false;
            }
        }
    }

    // Have sound system do some last updates
    gpSndSys->Update();
}